

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_fir_filter.cc
# Opt level: O1

void __thiscall
webrtc::SparseFIRFilter::Filter(SparseFIRFilter *this,float *in,size_t length,float *out)

{
  size_t sVar1;
  ulong uVar2;
  size_t __n;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  pointer pfVar6;
  pointer pfVar7;
  ulong uVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  float fVar12;
  
  if (length != 0) {
    sVar1 = this->sparsity_;
    uVar2 = this->offset_;
    pfVar6 = (this->nonzero_coeffs_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(this->nonzero_coeffs_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar6 >> 2;
    pfVar7 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar11 = in + -uVar2;
    uVar10 = 0;
    do {
      out[uVar10] = 0.0;
      if (uVar10 < uVar2) {
        uVar4 = 0;
      }
      else {
        uVar3 = 0;
        pfVar9 = pfVar11;
        uVar8 = uVar2;
        do {
          uVar4 = uVar5;
          if (uVar5 == uVar3) break;
          out[uVar10] = *pfVar9 * pfVar6[uVar3] + out[uVar10];
          uVar4 = uVar3 + 1;
          pfVar9 = pfVar9 + -sVar1;
          uVar8 = uVar8 + sVar1;
          uVar3 = uVar4;
        } while (uVar8 <= uVar10);
      }
      if (uVar4 < uVar5) {
        fVar12 = out[uVar10];
        pfVar9 = (float *)(((uVar5 - 1) - uVar4) * sVar1 * 4 + (long)pfVar7);
        do {
          fVar12 = fVar12 + *pfVar9 * pfVar6[uVar4];
          out[uVar10] = fVar12;
          uVar4 = uVar4 + 1;
          pfVar9 = pfVar9 + -sVar1;
        } while (uVar5 != uVar4);
      }
      uVar10 = uVar10 + 1;
      pfVar11 = pfVar11 + 1;
      pfVar7 = pfVar7 + 1;
    } while (uVar10 != length);
  }
  pfVar6 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar7 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __n = (long)pfVar7 - (long)pfVar6;
  if (__n == 0) {
    return;
  }
  uVar2 = (long)pfVar7 - (long)pfVar6 >> 2;
  if (uVar2 < length || uVar2 - length == 0) {
    in = in + (length - uVar2);
  }
  else {
    memmove(pfVar6,pfVar6 + length,(uVar2 - length) * 4);
    pfVar6 = (this->state_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar6 = pfVar6 + (((ulong)((long)(this->state_).
                                      super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)pfVar6) >> 2) -
                      length);
    __n = length << 2;
  }
  memcpy(pfVar6,in,__n);
  return;
}

Assistant:

void SparseFIRFilter::Filter(const float* in, size_t length, float* out) {
  // Convolves the input signal |in| with the filter kernel |nonzero_coeffs_|
  // taking into account the previous state.
  for (size_t i = 0; i < length; ++i) {
    out[i] = 0.f;
    size_t j;
    for (j = 0; i >= j * sparsity_ + offset_ &&
                j < nonzero_coeffs_.size(); ++j) {
      out[i] += in[i - j * sparsity_ - offset_] * nonzero_coeffs_[j];
    }
    for (; j < nonzero_coeffs_.size(); ++j) {
      out[i] += state_[i + (nonzero_coeffs_.size() - j - 1) * sparsity_] *
                nonzero_coeffs_[j];
    }
  }

  // Update current state.
  if (state_.size() > 0u) {
    if (length >= state_.size()) {
      std::memcpy(&state_[0],
                  &in[length - state_.size()],
                  state_.size() * sizeof(*in));
    } else {
      std::memmove(&state_[0],
                   &state_[length],
                   (state_.size() - length) * sizeof(state_[0]));
      std::memcpy(&state_[state_.size() - length], in, length * sizeof(*in));
    }
  }
}